

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

string * __thiscall
ser::FieldsTable::FieldFromJSON_abi_cxx11_
          (string *__return_storage_ptr__,FieldsTable *this,JSONNode *node)

{
  string *psVar1;
  undefined1 local_c8 [8];
  DataFieldInfo info;
  JSONNode *node_local;
  FieldsTable *this_local;
  
  info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)node;
  DataFieldInfo::DataFieldInfo((DataFieldInfo *)local_c8);
  DataFieldInfo::FromJSON
            ((DataFieldInfo *)local_c8,
             (JSONNode *)info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  RegisterField(this,(DataFieldInfo *)local_c8);
  psVar1 = DataFieldInfo::name_abi_cxx11_((DataFieldInfo *)local_c8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  DataFieldInfo::~DataFieldInfo((DataFieldInfo *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::FieldFromJSON(const JSONNode& node)
{
    DataFieldInfo info;
    info.FromJSON(node);
    RegisterField(info);
    return info.name();
}